

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  undefined8 uVar2;
  int iVar3;
  byte *end_00;
  byte *pbVar4;
  byte bVar5;
  char *pcVar6;
  undefined1 uVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  char cVar11;
  long lVar12;
  bool bVar13;
  
  if (ptr == end) {
    return -4;
  }
  uVar10 = (long)end - (long)ptr & 0xfffffffffffffffe;
  end_00 = (byte *)(ptr + uVar10);
  if (uVar10 == 0) {
    end_00 = (byte *)end;
  }
  bVar13 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar13) {
    end_00 = (byte *)end;
  }
  if (bVar13 && uVar10 == 0) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 < 0xdc) {
    uVar7 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar7 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_004d1c83:
        uVar7 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar7 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_004d1c83;
    uVar7 = 0;
  }
  switch(uVar7) {
  case 0:
  case 1:
  case 8:
switchD_004d1ca2_caseD_0:
    *nextTokPtr = ptr;
    return 0;
  case 2:
    pbVar8 = (byte *)(ptr + 2);
    if (pbVar8 == end_00) {
      return -1;
    }
    bVar1 = ptr[3];
    if (bVar1 < 0xdc) {
      cVar11 = '\a';
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          cVar11 = *(char *)((long)enc[1].scanners + (ulong)*pbVar8);
        }
        else {
LAB_004d1f0f:
          cVar11 = '\x1d';
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      cVar11 = '\b';
    }
    else {
      if ((bVar1 != 0xff) || (*pbVar8 < 0xfe)) goto LAB_004d1f0f;
      cVar11 = '\0';
    }
    switch(cVar11) {
    case '\x06':
switchD_004d1f32_caseD_6:
      pbVar4 = end_00 + -(long)pbVar8;
joined_r0x004d26c1:
      if ((long)pbVar4 < 3) {
        return -2;
      }
      break;
    case '\a':
switchD_004d1f32_caseD_7:
      pbVar4 = end_00 + -(long)pbVar8;
joined_r0x004d269f:
      if ((long)pbVar4 < 4) {
        return -2;
      }
      break;
    case '\b':
    case '\t':
    case '\n':
    case '\v':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x12':
    case '\x13':
    case '\x14':
    case '\x15':
    case '\x17':
      break;
    case '\x0f':
      iVar3 = little2_scanPi(enc,ptr + 4,(char *)end_00,nextTokPtr);
      return iVar3;
    case '\x10':
      pbVar8 = (byte *)(ptr + 4);
      if (pbVar8 == end_00) {
        return -1;
      }
      bVar1 = ptr[5];
      if (bVar1 < 0xdc) {
        cVar11 = '\a';
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            cVar11 = *(char *)((long)enc[1].scanners + (ulong)*pbVar8);
          }
          else {
LAB_004d24a3:
            cVar11 = '\x1d';
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        cVar11 = '\b';
      }
      else {
        if ((bVar1 != 0xff) || (*pbVar8 < 0xfe)) goto LAB_004d24a3;
        cVar11 = '\0';
      }
      if (cVar11 == '\x14') {
        pcVar6 = ptr + 6;
        if ((long)end_00 - (long)pcVar6 < 0xc) {
          return -1;
        }
        lVar12 = 0;
        while ((pcVar6[1] == '\0' && (*pcVar6 == (&big2_scanCdataSection_CDATA_LSQB)[lVar12]))) {
          lVar12 = lVar12 + 1;
          pcVar6 = pcVar6 + 2;
          if (lVar12 == 6) {
            *nextTokPtr = ptr + 0x12;
            return 8;
          }
        }
        *nextTokPtr = pcVar6;
        return 0;
      }
      if (cVar11 == '\x1b') {
        iVar3 = little2_scanComment(enc,ptr + 6,(char *)end_00,nextTokPtr);
        return iVar3;
      }
      break;
    case '\x11':
      pbVar8 = (byte *)(ptr + 4);
      if (pbVar8 == end_00) {
        return -1;
      }
      bVar1 = ptr[5];
      if (bVar1 < 0xdc) {
        bVar5 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            bVar5 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar8);
          }
          else {
LAB_004d2312:
            bVar5 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        bVar5 = 8;
      }
      else {
        if ((bVar1 != 0xff) || (*pbVar8 < 0xfe)) goto LAB_004d2312;
        bVar5 = 0;
      }
      if (0x15 < bVar5) {
        if (((bVar5 == 0x16) || (bVar5 == 0x18)) ||
           ((bVar5 == 0x1d &&
            ((*(uint *)((long)namingBitmap +
                       (ulong)(*pbVar8 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
              >> (*pbVar8 & 0x1f) & 1) != 0)))) {
          pbVar8 = (byte *)(ptr + 6);
          if (pbVar8 == end_00) {
            return -1;
          }
          pbVar4 = end_00 + (-6 - (long)ptr);
          do {
            bVar1 = pbVar8[1];
            if (bVar1 < 0xdc) {
              bVar5 = 7;
              if (3 < bVar1 - 0xd8) {
                if (bVar1 == 0) {
                  bVar5 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar8);
                }
                else {
LAB_004d243d:
                  bVar5 = 0x1d;
                }
              }
            }
            else if (bVar1 - 0xdc < 4) {
              bVar5 = 8;
            }
            else {
              if ((bVar1 != 0xff) || (*pbVar8 < 0xfe)) goto LAB_004d243d;
              bVar5 = 0;
            }
            if (5 < bVar5 - 0x16) {
              if (bVar5 != 0x1d) {
                pbVar9 = pbVar8;
                switch(bVar5) {
                case 5:
                  goto joined_r0x004d26b0;
                case 6:
                  goto joined_r0x004d26c1;
                case 7:
                  break;
                default:
                  goto switchD_004d1f32_caseD_8;
                case 9:
                case 10:
                case 0x15:
                  goto switchD_004d2535_caseD_9;
                case 0xb:
                  goto switchD_004d2535_caseD_b;
                }
                goto joined_r0x004d269f;
              }
              if ((*(uint *)((long)namingBitmap +
                            (ulong)(*pbVar8 >> 3 & 0x1c |
                                   (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
                   (*pbVar8 & 0x1f) & 1) == 0) break;
            }
            pbVar8 = pbVar8 + 2;
            pbVar4 = pbVar4 + -2;
            if (pbVar8 == end_00) {
              return -1;
            }
          } while( true );
        }
        break;
      }
      if (bVar5 != 5) {
        if (bVar5 != 6) {
          if (bVar5 != 7) break;
          goto switchD_004d1f32_caseD_7;
        }
        goto switchD_004d1f32_caseD_6;
      }
    case '\x05':
      pbVar4 = end_00 + -(long)pbVar8;
joined_r0x004d26b0:
      if ((long)pbVar4 < 2) {
        return -2;
      }
      break;
    case '\x16':
    case '\x18':
switchD_004d1f32_caseD_16:
      ptr = ptr + 4;
      if ((byte *)ptr == end_00) {
        return -1;
      }
      bVar13 = false;
      do {
        bVar1 = ((byte *)ptr)[1];
        if (bVar1 < 0xdc) {
          uVar7 = 7;
          if (3 < bVar1 - 0xd8) {
            if (bVar1 == 0) {
              uVar7 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
            }
            else {
LAB_004d1fb4:
              uVar7 = 0x1d;
            }
          }
        }
        else if (bVar1 - 0xdc < 4) {
          uVar7 = 8;
        }
        else {
          if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_004d1fb4;
          uVar7 = 0;
        }
        lVar12 = 2;
        switch(uVar7) {
        case 5:
          if ((long)end_00 - (long)ptr < 2) {
            return -2;
          }
          goto switchD_004d1ca2_caseD_0;
        case 6:
          if ((long)end_00 - (long)ptr < 3) {
            return -2;
          }
          goto switchD_004d1ca2_caseD_0;
        case 7:
          if ((long)end_00 - (long)ptr < 4) {
            return -2;
          }
        default:
          goto switchD_004d1ca2_caseD_0;
        case 9:
        case 10:
        case 0x15:
          pbVar8 = (byte *)ptr + 2;
          if (pbVar8 == end_00) {
            return -1;
          }
          pbVar4 = end_00 + -(long)ptr;
          goto LAB_004d224e;
        case 0xb:
          goto switchD_004d22bb_caseD_b;
        case 0x11:
          pbVar8 = (byte *)ptr;
          goto switchD_004d22bb_caseD_11;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          break;
        case 0x17:
          if (bVar13) goto switchD_004d1ca2_caseD_0;
          pbVar8 = (byte *)ptr + 2;
          if (pbVar8 == end_00) {
            return -1;
          }
          bVar1 = ((byte *)ptr)[3];
          if (bVar1 < 0xdc) {
            bVar5 = 7;
            if (3 < bVar1 - 0xd8) {
              if (bVar1 == 0) {
                bVar5 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar8);
              }
              else {
LAB_004d207b:
                bVar5 = 0x1d;
              }
            }
          }
          else if (bVar1 - 0xdc < 4) {
            bVar5 = 8;
          }
          else {
            if ((bVar1 != 0xff) || (*pbVar8 < 0xfe)) goto LAB_004d207b;
            bVar5 = 0;
          }
          if (bVar5 < 0x16) {
            if (bVar5 == 5) {
              if ((long)end_00 - (long)pbVar8 < 2) {
                return -2;
              }
            }
            else if (bVar5 == 6) {
              if ((long)end_00 - (long)pbVar8 < 3) {
                return -2;
              }
            }
            else if ((bVar5 == 7) && ((long)end_00 - (long)pbVar8 < 4)) {
              return -2;
            }
LAB_004d22f6:
            *nextTokPtr = (char *)pbVar8;
            return 0;
          }
          bVar13 = true;
          lVar12 = 4;
          if (((bVar5 != 0x16) && (bVar5 != 0x18)) &&
             ((bVar5 != 0x1d ||
              ((*(uint *)((long)namingBitmap +
                         (ulong)(*pbVar8 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)
                         ) >> (*pbVar8 & 0x1f) & 1) == 0)))) goto LAB_004d22f6;
          break;
        case 0x1d:
          if ((*(uint *)((long)namingBitmap +
                        (ulong)((byte)*ptr >> 3 & 0x1c |
                               (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
               ((byte)*ptr & 0x1f) & 1) == 0) goto switchD_004d1ca2_caseD_0;
        }
        ptr = (char *)((byte *)ptr + lVar12);
        if ((byte *)ptr == end_00) {
          return -1;
        }
      } while( true );
    default:
      if ((cVar11 == '\x1d') &&
         ((*(uint *)((long)namingBitmap +
                    (ulong)(*pbVar8 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
           (*pbVar8 & 0x1f) & 1) != 0)) goto switchD_004d1f32_caseD_16;
    }
switchD_004d1f32_caseD_8:
    *nextTokPtr = (char *)pbVar8;
    return 0;
  case 3:
    iVar3 = little2_scanRef(enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar3;
  case 4:
    pbVar8 = (byte *)(ptr + 2);
    if (pbVar8 == end_00) {
      return -5;
    }
    if (ptr[3] != '\0') goto joined_r0x004d1d67;
    if (*pbVar8 != 0x5d) goto joined_r0x004d1d67;
    pbVar4 = (byte *)(ptr + 4);
    if (pbVar4 == end_00) {
      return -5;
    }
    if (ptr[5] != '\0') goto joined_r0x004d1d67;
    bVar1 = *pbVar4;
joined_r0x004d1d1a:
    if (bVar1 == 0x3e) {
      *nextTokPtr = (char *)pbVar4;
      return 0;
    }
joined_r0x004d1d67:
    uVar2 = pbVar8;
    if ((byte *)uVar2 == end_00) {
      *nextTokPtr = (char *)uVar2;
      return 6;
    }
    bVar1 = *(byte *)(uVar2 + 1);
    if (bVar1 < 0xdc) {
      uVar7 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar7 = *(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)uVar2);
        }
        else {
LAB_004d1dc9:
          uVar7 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar7 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (*(byte *)uVar2 < 0xfe)) goto LAB_004d1dc9;
      uVar7 = 0;
    }
    switch(uVar7) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
    case 10:
      break;
    case 4:
      pbVar8 = (byte *)(uVar2 + 2);
      if (pbVar8 == end_00) break;
      if ((*(byte *)(uVar2 + 3) != 0) || (*pbVar8 != 0x5d)) goto joined_r0x004d1d67;
      pbVar4 = (byte *)(uVar2 + 4);
      if (pbVar4 == end_00) break;
      if (*(byte *)(uVar2 + 5) != 0) goto joined_r0x004d1d67;
      bVar1 = *pbVar4;
      goto joined_r0x004d1d1a;
    case 5:
      if ((long)end_00 - uVar2 < 2) break;
    default:
      pbVar8 = (byte *)(uVar2 + 2);
      goto joined_r0x004d1d67;
    case 6:
      if (2 < (long)end_00 - uVar2) {
        pbVar8 = (byte *)(uVar2 + 3);
        goto joined_r0x004d1d67;
      }
      break;
    case 7:
      if (3 < (long)end_00 - uVar2) {
        pbVar8 = (byte *)(uVar2 + 4);
        goto joined_r0x004d1d67;
      }
    }
    *nextTokPtr = (char *)uVar2;
    return 6;
  case 5:
    if ((long)end_00 - (long)ptr < 2) {
      return -2;
    }
  default:
    pbVar8 = (byte *)(ptr + 2);
    goto joined_r0x004d1d67;
  case 6:
    if ((long)end_00 - (long)ptr < 3) {
      return -2;
    }
    pbVar8 = (byte *)(ptr + 3);
    goto joined_r0x004d1d67;
  case 7:
    if ((long)end_00 - (long)ptr < 4) {
      return -2;
    }
    pbVar8 = (byte *)(ptr + 4);
    goto joined_r0x004d1d67;
  case 9:
    pbVar8 = (byte *)(ptr + 2);
    if (pbVar8 == end_00) {
      return -3;
    }
    if (ptr[3] == '\0') {
      bVar13 = *(char *)((long)enc[1].scanners + (ulong)*pbVar8) == '\n';
    }
    else {
      bVar13 = false;
    }
    if (bVar13) {
      pbVar8 = (byte *)(ptr + 4);
    }
    *nextTokPtr = (char *)pbVar8;
    break;
  case 10:
    *nextTokPtr = ptr + 2;
  }
  return 7;
LAB_004d224e:
  pbVar4 = pbVar4 + -2;
  bVar1 = pbVar8[1];
  if (bVar1 < 0xdc) {
    uVar7 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar7 = *(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar8);
      }
      else {
LAB_004d229f:
        uVar7 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar7 = 8;
  }
  else {
    if ((bVar1 != 0xff) || (*pbVar8 < 0xfe)) goto LAB_004d229f;
    uVar7 = 0;
  }
  ptr = (char *)pbVar8;
  switch(uVar7) {
  case 5:
    goto joined_r0x004d26b0;
  case 6:
    goto joined_r0x004d26c1;
  case 7:
    goto joined_r0x004d269f;
  default:
    goto switchD_004d1f32_caseD_8;
  case 9:
  case 10:
  case 0x15:
    goto switchD_004d22bb_caseD_9;
  case 0xb:
    goto switchD_004d22bb_caseD_b;
  case 0x11:
    break;
  case 0x16:
  case 0x18:
    goto switchD_004d22bb_caseD_16;
  case 0x1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(*pbVar8 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         (*pbVar8 & 0x1f) & 1) == 0) goto switchD_004d1f32_caseD_8;
switchD_004d22bb_caseD_16:
    iVar3 = little2_scanAtts(enc,(char *)(pbVar8 + 2),(char *)end_00,nextTokPtr);
    return iVar3;
  }
switchD_004d22bb_caseD_11:
  ptr = (char *)(pbVar8 + 2);
  if ((byte *)ptr == end_00) {
    return -1;
  }
  if ((pbVar8[3] == 0) && (*ptr == 0x3e)) {
    *nextTokPtr = (char *)(pbVar8 + 4);
    return 4;
  }
  goto switchD_004d1ca2_caseD_0;
switchD_004d22bb_caseD_9:
  pbVar8 = pbVar8 + 2;
  if (pbVar8 == end_00) {
    return -1;
  }
  goto LAB_004d224e;
switchD_004d2535_caseD_9:
  do {
    pbVar8 = pbVar9 + 2;
    if (pbVar8 == end_00) {
      return -1;
    }
    bVar1 = pbVar9[3];
    if (bVar1 < 0xdc) {
      bVar5 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar5 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar8);
        }
        else {
LAB_004d259a:
          bVar5 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar5 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (*pbVar8 < 0xfe)) goto LAB_004d259a;
      bVar5 = 0;
    }
    pbVar9 = pbVar8;
  } while ((bVar5 - 9 < 2) || (bVar5 == 0x15));
  if (bVar5 == 0xb) {
switchD_004d2535_caseD_b:
    *nextTokPtr = (char *)(pbVar8 + 2);
    return 5;
  }
  goto switchD_004d1f32_caseD_8;
switchD_004d22bb_caseD_b:
  *nextTokPtr = (char *)((byte *)ptr + 2);
  return 2;
}

Assistant:

static
int PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                       const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (ptr + MINBPC(enc) != end) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (ptr + 2*MINBPC(enc) != end) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}